

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FLog.cpp
# Opt level: O0

void FLog::mfree(time_t dateTime,int line,string *function,string *file)

{
  id __id;
  char *pcVar1;
  long lVar2;
  ostream *this;
  allocator<char> local_579;
  string local_578;
  allocator<char> local_551;
  string local_550;
  string local_530;
  string local_510;
  allocator<char> local_4e9;
  string local_4e8;
  Log local_4c8;
  undefined1 local_428 [8];
  mutex locker;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  undefined1 local_220 [8];
  string temp;
  undefined1 local_1f8 [8];
  string timeTemp;
  string threadIdStr;
  ostringstream local_1a0 [8];
  ostringstream sstream;
  string *file_local;
  string *function_local;
  time_t tStack_10;
  int line_local;
  time_t dateTime_local;
  
  tStack_10 = dateTime;
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  __id = std::this_thread::get_id();
  std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)local_1a0,__id);
  std::__cxx11::ostringstream::str();
  if ((int)logLevel < 2) {
    if ((printWarning & 1U) != 0 || (printAll & 1U) != 0) {
      pcVar1 = ctime(&stack0xfffffffffffffff0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1f8,pcVar1,(allocator<char> *)(temp.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(temp.field_2._M_local_buf + 0xf));
      lVar2 = std::__cxx11::string::size();
      std::__cxx11::string::replace((ulong)local_1f8,lVar2 - 1,(char *)0x1);
      std::operator+(&local_3e0," [DateTime: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8)
      ;
      std::operator+(&local_3c0,&local_3e0," ] ");
      std::operator+(&local_3a0,&local_3c0," [Type: Free ] ");
      std::operator+(&local_380,&local_3a0," [Line: ");
      std::__cxx11::to_string
                ((string *)&locker.super___mutex_base._M_mutex.__data.__list.__next,line);
      std::operator+(&local_360,&local_380,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &locker.super___mutex_base._M_mutex.__data.__list.__next);
      std::operator+(&local_340,&local_360," ] ");
      std::operator+(&local_320,&local_340," [Function: ");
      std::operator+(&local_300,&local_320,function);
      std::operator+(&local_2e0,&local_300," ] ");
      std::operator+(&local_2c0,&local_2e0," [Thread Id: ");
      std::operator+(&local_2a0,&local_2c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&timeTemp.field_2 + 8));
      std::operator+(&local_280,&local_2a0," ] ");
      std::operator+(&local_260,&local_280," [File: ");
      std::operator+(&local_240,&local_260,file);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220,
                     &local_240," ] ");
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_300);
      std::__cxx11::string::~string((string *)&local_320);
      std::__cxx11::string::~string((string *)&local_340);
      std::__cxx11::string::~string((string *)&local_360);
      std::__cxx11::string::~string
                ((string *)&locker.super___mutex_base._M_mutex.__data.__list.__next);
      std::__cxx11::string::~string((string *)&local_380);
      std::__cxx11::string::~string((string *)&local_3a0);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::__cxx11::string::~string((string *)&local_3e0);
      std::mutex::mutex((mutex *)local_428);
      std::mutex::lock((mutex *)local_428);
      this = std::operator<<((ostream *)&std::clog,(string *)local_220);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      std::mutex::unlock((mutex *)local_428);
      std::__cxx11::string::~string((string *)local_220);
      std::__cxx11::string::~string((string *)local_1f8);
    }
    pcVar1 = ctime(&stack0xfffffffffffffff0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e8,pcVar1,&local_4e9);
    std::__cxx11::to_string(&local_510,line);
    std::__cxx11::string::string((string *)&local_530,(string *)file);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_550,"Free ",&local_551);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_578,"warning",&local_579);
    FONQRI::Log::Log(&local_4c8,&local_4e8,&local_510,&local_530,&local_550,&local_578);
    std::vector<FONQRI::Log,_std::allocator<FONQRI::Log>_>::push_back(&normalLogList,&local_4c8);
    FONQRI::Log::~Log(&local_4c8);
    std::__cxx11::string::~string((string *)&local_578);
    std::allocator<char>::~allocator(&local_579);
    std::__cxx11::string::~string((string *)&local_550);
    std::allocator<char>::~allocator(&local_551);
    std::__cxx11::string::~string((string *)&local_530);
    std::__cxx11::string::~string((string *)&local_510);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::allocator<char>::~allocator(&local_4e9);
    std::vector<FONQRI::Log,_std::allocator<FONQRI::Log>_>::size(&normalLogList);
  }
  std::__cxx11::string::~string((string *)(timeTemp.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return;
}

Assistant:

void FLog::mfree(const time_t dateTime, int line, std::string function,
		 std::string file)
{

	// get thread id and convert it to string
	std::ostringstream sstream;
	sstream << std::this_thread::get_id();
	std::string threadIdStr = sstream.str();

	if (logLevel < FLog::important) {
		if (FLog::printWarning | FLog::printAll) {
			std::string timeTemp = std::string(std::ctime(&dateTime));
			timeTemp.replace(timeTemp.size() - 1, 1, "");
			std::string temp =
			" [DateTime: " + timeTemp + " ] " + " [Type: Free ] " +
			" [Line: " + std::to_string(line) + " ] " +
			" [Function: " + function + " ] " + " [Thread Id: " +
			threadIdStr + " ] " + " [File: " + file + " ] ";
			std::mutex locker;
			locker.lock();
			std::clog << temp << std::endl;
			locker.unlock();
		}
		FLog::normalLogList.push_back(
		FONQRI::Log(std::string(std::ctime(&dateTime)),
				std::to_string(line), file, "Free ", "warning"));

		if (FLog::normalLogList.size() >= FLog::logCounts) {
			// NOTE you can save save normalLogList  to database
		}
	}
}